

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TypedefDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_4,Token *args_5)

{
  Token typedefKeyword;
  Token name;
  Token semi;
  TypedefDeclarationSyntax *this_00;
  
  this_00 = (TypedefDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TypedefDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (TypedefDeclarationSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  typedefKeyword.kind = args_1->kind;
  typedefKeyword._2_1_ = args_1->field_0x2;
  typedefKeyword.numFlags.raw = (args_1->numFlags).raw;
  typedefKeyword.rawLen = args_1->rawLen;
  typedefKeyword.info = args_1->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  name.kind = args_3->kind;
  name._2_1_ = args_3->field_0x2;
  name.numFlags.raw = (args_3->numFlags).raw;
  name.rawLen = args_3->rawLen;
  name.info = args_3->info;
  slang::syntax::TypedefDeclarationSyntax::TypedefDeclarationSyntax
            (this_00,args,typedefKeyword,args_2,name,args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }